

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O2

void hashlin_shrink_step(tommy_hashlin *hashlin)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  tommy_count_t tVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = hashlin->count;
  if (hashlin->state != 2) {
    if ((hashlin->bucket_max >> 3 <= uVar7) || (hashlin->bucket_bit < 7)) goto LAB_0010fdf6;
    if (hashlin->state == 0) {
      uVar6 = hashlin->bucket_max >> 1;
      hashlin->low_max = uVar6;
      hashlin->low_mask = hashlin->bucket_mask >> 1;
      hashlin->split = uVar6;
    }
    hashlin->state = 2;
  }
  tVar5 = hashlin->split;
  do {
    if (hashlin->low_max + tVar5 <= uVar7 << 3) goto LAB_0010fdf6;
    uVar6 = tVar5 - 1;
    hashlin->split = uVar6;
    uVar2 = 0x1f;
    if ((uVar6 | 1) != 0) {
      for (; (uVar6 | 1) >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar8 = (tVar5 + hashlin->low_max) - 1;
    uVar4 = uVar8 | 1;
    uVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    tommy_list_concat(hashlin->bucket[uVar2] + uVar6,hashlin->bucket[uVar3] + uVar8);
    tVar5 = hashlin->split;
  } while (tVar5 != 0);
  uVar7 = hashlin->bucket_bit - 1;
  tVar5 = 1 << ((byte)uVar7 & 0x1f);
  hashlin->bucket_bit = uVar7;
  hashlin->bucket_max = tVar5;
  hashlin->bucket_mask = tVar5 - 1;
  lrtr_free(hashlin->bucket[uVar7] + (1L << ((byte)uVar7 & 0x3f)));
  hashlin->state = 0;
  hashlin->low_max = hashlin->bucket_max;
  hashlin->low_mask = hashlin->bucket_mask;
  hashlin->split = 0;
LAB_0010fdf6:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void hashlin_shrink_step(tommy_hashlin* hashlin)
{
	/* shrink if less than 12.5% full */
	if (hashlin->state != TOMMY_HASHLIN_STATE_SHRINK
		&& hashlin->count < hashlin->bucket_max / 8
	) {
		/* avoid to shrink the first bucket */
		if (hashlin->bucket_bit > TOMMY_HASHLIN_BIT) {
			/* if we are stable, setup a new shrink state */
			/* otherwise continue with the already setup grow one */
			/* but in backward direction */
			if (hashlin->state == TOMMY_HASHLIN_STATE_STABLE) {
				/* set the lower size */
				hashlin->low_max = hashlin->bucket_max / 2;
				hashlin->low_mask = hashlin->bucket_mask / 2;

				/* start from the half going backward */
				hashlin->split = hashlin->low_max;
			}

			/* start reallocation */
			hashlin->state = TOMMY_HASHLIN_STATE_SHRINK;
		}
	}

	/* if we are shrinking */
	if (hashlin->state == TOMMY_HASHLIN_STATE_SHRINK) {
		/* compute the split target required to finish the reallocation before the next resize */
		tommy_count_t split_target = 8 * hashlin->count;

		/* reallocate buckets until the split target */
		while (hashlin->split + hashlin->low_max > split_target) {
			tommy_hashlin_node** split[2];

			/* go backward position */
			--hashlin->split;

			/* get the low bucket */
			split[0] = tommy_hashlin_pos(hashlin, hashlin->split);

			/* get the high bucket */
			split[1] = tommy_hashlin_pos(hashlin, hashlin->split + hashlin->low_max);

			/* concat the high bucket into the low one */
			tommy_list_concat(split[0], split[1]);

			/* if we have finished, clean up and change the state */
			if (hashlin->split == 0) {
				tommy_hashlin_node** segment;

				/* shrink the hash size */
				--hashlin->bucket_bit;
				hashlin->bucket_max = 1 << hashlin->bucket_bit;
				hashlin->bucket_mask = hashlin->bucket_max - 1;

				/* free the last segment */
				segment = hashlin->bucket[hashlin->bucket_bit];
				tommy_free(&segment[((tommy_ptrdiff_t)1) << hashlin->bucket_bit]);

				/* go in stable mode */
				tommy_hashlin_stable(hashlin);
				break;
			}
		}
	}
}